

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenDefaultBufferValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  BaseType BVar2;
  pointer pcVar3;
  int iVar4;
  Type *type;
  char *pcVar5;
  string suffix;
  string field_name;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  BVar1 = (field->value).type.base_type;
  pcVar3 = (field->super_Definition).name._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar3,pcVar3 + (field->super_Definition).name._M_string_length);
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    LiteralSuffix_abi_cxx11_(&local_60,(KotlinKMPGenerator *)&field->value,type);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  }
  BVar2 = (field->value).type.base_type;
  if ((BVar2 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
  }
  else if (BVar1 - BASE_TYPE_FLOAT < 2) {
    FloatConstantGenerator::GenFloatConstant_abi_cxx11_
              (__return_storage_ptr__,
               (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,field);
    if ((BVar1 == BASE_TYPE_DOUBLE) &&
       ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        'f')) {
      std::__cxx11::string::pop_back();
    }
  }
  else if (BVar1 == BASE_TYPE_BOOL) {
    iVar4 = std::__cxx11::string::compare((char *)&(field->value).constant);
    pcVar5 = "true";
    if (iVar4 == 0) {
      pcVar5 = "false";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar5 + (ulong)(iVar4 == 0) + 4);
  }
  else {
    if ((9 < BVar2 - BASE_TYPE_UTYPE) || ((field->value).type.enum_def == (EnumDef *)0x0)) {
      BVar1 = (field->value).type.element;
      if ((BVar1 == BASE_TYPE_UTYPE && (BVar2 - BASE_TYPE_VECTOR & 0xfffffffb) == 0) ||
         (((BVar2 == BASE_TYPE_VECTOR64 || (BVar2 == BASE_TYPE_VECTOR)) &&
          (BVar1 == BASE_TYPE_UNION)))) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = (field->value).constant._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar3,
                   pcVar3 + (field->value).constant._M_string_length);
        goto LAB_001f8f53;
      }
    }
    std::operator+(__return_storage_ptr__,&(field->value).constant,&local_60);
  }
LAB_001f8f53:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultBufferValue(const FieldDef &field) const {
    auto &value = field.value;
    auto base_type = value.type.base_type;
    auto field_name = field.name;
    std::string suffix = IsScalar(base_type) ? LiteralSuffix(value.type) : "";
    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    if (IsEnum(field.value.type)) {
      return value.constant + suffix;
    } else if ((IsVector(field.value.type) &&
                field.value.type.element == BASE_TYPE_UTYPE) ||
               (IsVector(field.value.type) &&
                field.value.type.VectorType().base_type == BASE_TYPE_UNION)) {
      return value.constant;
    } else {
      return value.constant + suffix;
    }
  }